

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_event_trigger.c
# Opt level: O2

void * event_trigger_thread(void *param)

{
  pthread_cond_t *__cond;
  pthread_mutex_t *__mutex;
  int *piVar1;
  __time_t _Var2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  timespec final_time;
  timeval curr_time;
  timeval curr_time_1;
  
  gettimeofday((timeval *)&curr_time,(__timezone_ptr_t)0x0);
  _Var2 = curr_time.tv_sec;
  lVar4 = curr_time.tv_usec / -1000;
  __cond = (pthread_cond_t *)((long)param + 0x10);
  iVar3 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
  if ((iVar3 == 0) &&
     (iVar3 = pthread_mutex_init((pthread_mutex_t *)((long)param + 0x40),(pthread_mutexattr_t *)0x0)
     , iVar3 == 0)) {
    *(undefined4 *)((long)param + 0x68) = *(undefined4 *)(*(long *)((long)param + 0x80) + 8);
    _mpp_log_l(4,0,"with %u\n","event_create");
  }
  __mutex = (pthread_mutex_t *)((long)param + 0x40);
  while( true ) {
    iVar3 = *(int *)((long)param + 0x68);
    gettimeofday((timeval *)&curr_time_1,(__timezone_ptr_t)0x0);
    lVar7 = (ulong)(uint)(iVar3 * 10000000) + curr_time_1.tv_usec;
    final_time.tv_sec = lVar7 / 1000000 + curr_time_1.tv_sec;
    final_time.tv_nsec = (lVar7 % 1000000) * 1000;
    pthread_mutex_lock(__mutex);
    iVar3 = 0;
    while (*(int *)((long)param + 0x68) != 0) {
      iVar3 = pthread_cond_timedwait(__cond,__mutex,(timespec *)&final_time);
      if (iVar3 != 0) {
        *(int *)((long)param + 0x68) = *(int *)((long)param + 0x68) + -1;
      }
    }
    *(undefined4 *)((long)param + 0x68) = 0xffffffff;
    pthread_mutex_unlock(__mutex);
    if (*(int *)((long)param + 0x78) == 0) goto LAB_00105cc7;
    if (iVar3 == 0x6e) break;
    gettimeofday((timeval *)&curr_time,(__timezone_ptr_t)0x0);
    _mpp_log_l(4,0,"[%ld ms] event idx %d triggered\n",0,
               (curr_time.tv_sec - _Var2) * 1000 + lVar4 + curr_time.tv_usec / 1000,
               *(undefined4 *)((long)param + 0x88));
    _mpp_log_l(4,0,"cnt %d\n",0,**(undefined4 **)((long)param + 0x80));
    (**(code **)((long)param + 8))
              (*(undefined8 *)((long)param + 0x90),
               *(undefined8 *)
                (*(int **)((long)param + 0x80) +
                (long)(*(int *)((long)param + 0x88) % **(int **)((long)param + 0x80)) * 4 + 4));
    pthread_mutex_lock(__mutex);
    piVar1 = *(int **)((long)param + 0x80);
    iVar3 = *piVar1;
    lVar7 = (long)(*(int *)((long)param + 0x88) % iVar3);
    iVar5 = *(int *)((long)param + 0x88) + 1;
    *(int *)((long)param + 0x88) = iVar5;
    lVar6 = (long)(iVar5 % iVar3);
    _mpp_log_l(4,0,"curr %d, next %d\n",0,piVar1[lVar7 * 4 + 2],piVar1[lVar6 * 4 + 2]);
    iVar3 = piVar1[lVar6 * 4 + 2] - piVar1[lVar7 * 4 + 2];
    if (iVar3 == 0 || piVar1[lVar6 * 4 + 2] < piVar1[lVar7 * 4 + 2]) {
      iVar5 = *(int *)(*(long *)((long)param + 0x80) + 4);
      if (0 < iVar5) {
        iVar3 = iVar3 + iVar5;
        goto LAB_00105c6f;
      }
      *(undefined4 *)((long)param + 0x78) = 0;
      iVar3 = *(int *)((long)param + 0x68);
    }
    else {
LAB_00105c6f:
      *(int *)((long)param + 0x68) = iVar3;
    }
    _mpp_log_l(4,0,"semval %u\n","event_init",iVar3);
    pthread_mutex_unlock(__mutex);
    if (*(int *)((long)param + 0x78) == 0) {
LAB_00105cc7:
      pthread_cond_destroy(__cond);
      pthread_mutex_destroy(__mutex);
      _mpp_log_l(4,0,"exit\n","event_trigger_thread");
      return (void *)0x0;
    }
  }
  _mpp_log_l(2,0,"wait event timeout\n",0);
  goto LAB_00105cc7;
}

Assistant:

static void *event_trigger_thread(void *param)
{
    struct event_ctx_impl *ctx = (struct event_ctx_impl *)param;
    struct timeval curr_time;
    long start_time, curr;
    RK_S32 ret;

    gettimeofday(&curr_time, NULL);

    start_time = curr_time.tv_sec * 1000 + curr_time.tv_usec / 1000;
    event_create(ctx);

    while (1) {
        ret = event_timed_wait(ctx, ctx->semval * 10000);
        if (!ctx->flag)
            break;

        if (ret == ETIMEDOUT) {
            mpp_err("wait event timeout\n");
            break;
        }

        gettimeofday(&curr_time, NULL);

        curr = curr_time.tv_sec * 1000 + curr_time.tv_usec / 1000;
        /* TODO, trigger event */
        mpp_log("[%ld ms] event idx %d triggered\n",
                curr - start_time, ctx->event_idx);
        mpp_log("cnt %d\n", ctx->ea->cnt);
        ctx->trigger(ctx->parent, ctx->ea->e[ctx->event_idx % ctx->ea->cnt].event);

        /* schedule next event */
        event_init(ctx);
        if (!ctx->flag)
            break;
    }

    event_destroy(ctx);

    mpp_log_f("exit\n");

    return NULL;
}